

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strs.c
# Opt level: O0

char * nni_strcasestr(char *s1,char *s2)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  char *local_30;
  char *t2;
  char *t1;
  char *s2_local;
  char *s1_local;
  
  s2_local = s1;
  do {
    if (*s2_local == '\0') {
      return (char *)0x0;
    }
    t2 = s2_local;
    local_30 = s2;
    while( true ) {
      bVar3 = false;
      if (*t2 != '\0') {
        bVar3 = *local_30 != '\0';
      }
      if (!bVar3) break;
      iVar1 = tolower((int)*t2);
      iVar2 = tolower((int)*local_30);
      if (iVar1 != iVar2) break;
      local_30 = local_30 + 1;
      t2 = t2 + 1;
    }
    if (*local_30 == '\0') {
      return s2_local;
    }
    s2_local = s2_local + 1;
  } while( true );
}

Assistant:

char *
nni_strcasestr(const char *s1, const char *s2)
{
#ifdef NNG_HAVE_STRCASESTR
	return (strcasestr(s1, s2));
#else
	const char *t1, *t2;
	while (*s1) {
		for (t1 = s1, t2 = s2; *t1 && *t2; t2++, t1++) {
			if (tolower(*t1) != tolower(*t2)) {
				break;
			}
		}
		if (*t2 == 0) {
			return ((char *) s1);
		}
		s1++;
	}
	return (NULL);
#endif
}